

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  int iVar3;
  TextReader<fmt::Locale> *this_00;
  PairwiseArgHandler args;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case ATLEAST:
    ReadNumericExpr(this,false);
    this_00 = this->reader_;
    pcVar2 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar2;
    (this_00->super_ReaderBase).ptr_ = pcVar2 + 1;
    if (*pcVar2 == 'o') {
      iVar3 = ReadOpCode(this);
      if (OpCodeInfo::INFO[iVar3].kind != COUNT) {
        this_00 = this->reader_;
        goto LAB_0032e7c3;
      }
    }
    else {
LAB_0032e7c3:
      TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x3827fa);
    }
    ReadCountExpr(this);
    break;
  case IMPLICATION:
    ReadLogicalExpr(this);
    ReadLogicalExpr(this);
LAB_0032e80c:
    ReadLogicalExpr(this);
    break;
  case EXISTS:
    iVar3 = ReadNumArgs(this,3);
    NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::ArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
                *)this,iVar3,&args);
    break;
  case ALLDIFF:
    iVar3 = ReadNumArgs(this,1);
    NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::ArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
                *)this,iVar3,&args);
    break;
  default:
    if (KVar1 == FIRST_RELATIONAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::NumericExprReader>
                         *)&args,this);
      return (LogicalExpr)(Impl *)0x0;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::LogicalExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::LogicalExprReader>
                         *)&args,this);
      return (LogicalExpr)(Impl *)0x0;
    }
    if (KVar1 == NOT) goto LAB_0032e80c;
  case ATMOST:
  case EXACTLY:
  case NOT_ATLEAST:
  case NOT_ATMOST:
  case LAST_LOGICAL_COUNT:
  case FORALL:
    TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x382814);
  }
  return (LogicalExpr)(Impl *)0x0;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}